

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelVoidsElement::IfcRelVoidsElement(IfcRelVoidsElement *this)

{
  IfcRelVoidsElement *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xc8,"IfcRelVoidsElement");
  IfcRelConnects::IfcRelConnects(&this->super_IfcRelConnects,&PTR_construction_vtable_24__00e7b468);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelVoidsElement,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelVoidsElement,_2UL> *)
             &(this->super_IfcRelConnects).super_IfcRelationship.field_0xa8,
             &PTR_construction_vtable_24__00e7b4e0);
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0xe7b3b0;
  *(undefined8 *)&this->field_0xc8 = 0xe7b450;
  *(undefined8 *)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x88 =
       0xe7b3d8;
  *(undefined8 *)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x98 =
       0xe7b400;
  *(undefined8 *)&(this->super_IfcRelConnects).super_IfcRelationship.field_0xa8 = 0xe7b428;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcElement>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcElement> *)&(this->super_IfcRelConnects).field_0xb8,
             (LazyObject *)0x0);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFeatureElementSubtraction>::Lazy
            (&this->RelatedOpeningElement,(LazyObject *)0x0);
  return;
}

Assistant:

IfcRelVoidsElement() : Object("IfcRelVoidsElement") {}